

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O0

void borg_cheat_quiver(void)

{
  object *obj_00;
  char *pcVar1;
  object *obj;
  wchar_t i;
  wchar_t j;
  char buf [256];
  
  obj._4_4_ = 0;
  obj._0_4_ = z_info->pack_size + 0xc;
  for (; obj._4_4_ < (int)(uint)z_info->quiver_size; obj._4_4_ = obj._4_4_ + 1) {
    memset(borg_items + (int)obj,0,0x388);
    obj_00 = player->upkeep->quiver[obj._4_4_];
    if (((obj_00 != (object *)0x0) && (i._0_1_ = 0, obj_00->kind != (object_kind *)0x0)) &&
       (i._0_1_ = 0, obj_00->kind != (object_kind *)0x0)) {
      object_desc((char *)&i,0x100,obj_00,3,player);
      borg_item_analyze(borg_items + (int)obj,obj_00,(char *)&i,false);
      pcVar1 = strstr(borg_items[(int)obj].desc,"!");
      if ((pcVar1 != (char *)0x0) ||
         (pcVar1 = strstr(borg_items[(int)obj].desc,"borg"), pcVar1 != (char *)0x0)) {
        borg_deinscribe((int)obj);
      }
    }
    obj._0_4_ = (int)obj + 1;
  }
  return;
}

Assistant:

static void borg_cheat_quiver(void)
{
    char buf[256];

    /* Extract the quiver */
    for (int j = 0, i = QUIVER_START; j < z_info->quiver_size; i++, j++) {
        memset(&borg_items[i], 0, sizeof(borg_item));

        struct object *obj = player->upkeep->quiver[j];
        if (obj) {
            /* Default to "nothing" */
            buf[0] = '\0';

            /* skip non items */
            if (!obj->kind)
                continue;

            /* Default to "nothing" */
            buf[0] = '\0';

            /* Describe a real item */
            if (obj->kind) {
                /* Describe it */
                object_desc(buf, sizeof(buf), obj, ODESC_FULL, player);

                /* Analyze the item (no price) */
                borg_item_analyze(&borg_items[i], obj, buf, false);

                /* Uninscribe items with ! or borg inscriptions */
                if (strstr(borg_items[i].desc, "!") || strstr(borg_items[i].desc, "borg"))
                    borg_deinscribe(i);
            }
        }
    }
}